

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_stress_test.cpp
# Opt level: O0

void __thiscall
density_tests::allocator_stress_test::Impl::run(Impl *this,ThreadData *i_data,uint64_t i_cpu_index)

{
  size_t i_max_memory;
  bool bVar1;
  uintptr_t uVar2;
  double dVar3;
  undefined1 auVar4 [16];
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1430;
  rep local_1428;
  type activity_duration;
  double bytes_to_mb;
  time_point activity_start;
  duration<long,_std::ratio<1L,_1000000L>_> local_13f8;
  microseconds wait_duration;
  bool should_allocate;
  anon_class_1_0_00000001 nano_to_seconds;
  anon_class_1_0_00000001 micro_to_seconds;
  duration local_13e0;
  undefined1 local_13d8 [8];
  page_warehouse warehouse;
  EasyRandom rand;
  uint64_t i_cpu_index_local;
  ThreadData *i_data_local;
  Impl *this_local;
  
  rand.m_deterministic = SUB81(i_cpu_index,0);
  set_thread_affinity(1L << (rand.m_deterministic & 0x3fU));
  set_thread_priority(critical);
  EasyRandom::EasyRandom((EasyRandom *)&warehouse.m_timeout);
  i_max_memory = (this->m_config).m_max_memory_per_cpu;
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::
  duration<long,std::ratio<1l,1000000l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_13e0,
             &(this->m_config).m_allocation_timeout);
  anon_unknown_5::page_warehouse::page_warehouse
            ((page_warehouse *)local_13d8,i_max_memory,local_13e0);
  anon_unknown_5::wait_counter::increment(&this->m_started_threads);
  wait_duration.__r._1_1_ = 0;
  while( true ) {
    bVar1 = std::atomic<bool>::load(&this->m_should_exit,memory_order_seq_cst);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    activity_start.__d.__r =
         (duration)
         random_duration((EasyRandom *)&warehouse.m_timeout,
                         (microseconds)(this->m_config).m_min_wait.__r,
                         (microseconds)(this->m_config).m_max_wait.__r);
    local_13f8.__r = (rep)activity_start.__d.__r;
    dVar3 = run::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&wait_duration.__r + 3),
                       (microseconds)activity_start.__d.__r);
    Statistics::sample(&i_data->m_inactivity_time,dVar3);
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_13f8);
    bytes_to_mb = (double)std::chrono::_V2::steady_clock::now();
    wait_duration.__r._1_1_ = (wait_duration.__r._1_1_ ^ 0xff) & 1;
    if (wait_duration.__r._1_1_ == 0) {
      activity_duration.__r = 0x3eb0000000000000;
      uVar2 = anon_unknown_5::page_warehouse::allocated_memory((page_warehouse *)local_13d8);
      auVar4._8_4_ = (int)(uVar2 >> 0x20);
      auVar4._0_8_ = uVar2;
      auVar4._12_4_ = 0x45300000;
      Statistics::sample(&i_data->m_used_memory,
                         ((auVar4._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) *
                         9.5367431640625e-07);
      anon_unknown_5::page_warehouse::deallocation_loop((page_warehouse *)local_13d8);
    }
    else {
      anon_unknown_5::page_warehouse::allocation_loop((page_warehouse *)local_13d8);
    }
    local_1430.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_1428 = (rep)std::chrono::operator-
                                (&local_1430,
                                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&bytes_to_mb);
    dVar3 = run::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&wait_duration.__r + 2),
                       (nanoseconds)local_1428);
    Statistics::sample(&i_data->m_activity_time,dVar3);
  }
  anon_unknown_5::page_warehouse::~page_warehouse((page_warehouse *)local_13d8);
  return;
}

Assistant:

void run(ThreadData & i_data, uint64_t i_cpu_index)
        {
            set_thread_affinity(uint64_t(1) << i_cpu_index);
            set_thread_priority(thread_priority::critical);
            EasyRandom rand;

            page_warehouse warehouse(m_config.m_max_memory_per_cpu, m_config.m_allocation_timeout);

            m_started_threads.increment();

            auto micro_to_seconds = [](std::chrono::microseconds i_microseconds) {
                double const mult = 1. / (1000. * 1000.);
                return static_cast<double>(i_microseconds.count()) * mult;
            };

            auto nano_to_seconds = [](std::chrono::nanoseconds i_nanoseconds) {
                double const mult = 1. / (1000. * 1000. * 1000.);
                return static_cast<double>(i_nanoseconds.count()) * mult;
            };

            bool should_allocate = false;
            while (!m_should_exit.load())
            {
                auto const wait_duration =
                  random_duration(rand, m_config.m_min_wait, m_config.m_max_wait);

                i_data.m_inactivity_time.sample(micro_to_seconds(wait_duration));

                std::this_thread::sleep_for(wait_duration);

                auto const activity_start = std::chrono::steady_clock::now();

                should_allocate = !should_allocate;
                if (should_allocate)
                {
                    warehouse.allocation_loop();
                }
                else
                {
                    double const bytes_to_mb = 1. / (1024. * 1024.);
                    i_data.m_used_memory.sample(warehouse.allocated_memory() * bytes_to_mb);
                    warehouse.deallocation_loop();
                }

                auto const activity_duration = std::chrono::steady_clock::now() - activity_start;

                i_data.m_activity_time.sample(nano_to_seconds(activity_duration));
            }
        }